

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O1

int lquerytype(lua_State *L)

{
  int iVar1;
  sproto *sp;
  char *type_name;
  sproto_type *p;
  
  sp = (sproto *)lua_touserdata(L,1);
  if (sp == (sproto *)0x0) {
    iVar1 = luaL_argerror(L,1,"Need a sproto object");
    return iVar1;
  }
  type_name = luaL_checklstring(L,2,(size_t *)0x0);
  p = sproto_type(sp,type_name);
  if (p != (sproto_type *)0x0) {
    lua_pushlightuserdata(L,p);
    return 1;
  }
  iVar1 = luaL_error(L,"type %s not found",type_name);
  return iVar1;
}

Assistant:

static int
lquerytype(lua_State *L) {
	const char * type_name;
	struct sproto *sp = lua_touserdata(L,1);
	struct sproto_type *st;
	if (sp == NULL) {
		return luaL_argerror(L, 1, "Need a sproto object");
	}
	type_name = luaL_checkstring(L,2);
	st = sproto_type(sp, type_name);
	if (st) {
		lua_pushlightuserdata(L, st);
		return 1;
	}

	return luaL_error(L, "type %s not found", type_name);
}